

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void js_array_mark(JSRuntime *rt,JSValue val,JS_MarkFunc *mark_func)

{
  JSValueUnion JVar1;
  long lVar2;
  ulong uVar3;
  
  JVar1 = val.u;
  if (*(int *)((long)JVar1.ptr + 0x40) != 0) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      if ((~*(uint *)(*(long *)((long)JVar1.ptr + 0x38) + lVar2) & 0xfffffffe) == 0) {
        (*mark_func)(rt,*(JSGCObjectHeader **)(*(long *)((long)JVar1.ptr + 0x38) + -8 + lVar2));
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < *(uint *)((long)JVar1.ptr + 0x40));
  }
  return;
}

Assistant:

static void js_array_mark(JSRuntime *rt, JSValueConst val,
                          JS_MarkFunc *mark_func)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    int i;

    for(i = 0; i < p->u.array.count; i++) {
        JS_MarkValue(rt, p->u.array.u.values[i], mark_func);
    }
}